

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

bool __thiscall
QToolBarAreaLayout::restoreState
          (QToolBarAreaLayout *this,QDataStream *stream,QList<QToolBar_*> *_toolBars,uchar tmarker,
          bool testing)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  QWidget *widget;
  QWidgetItemV2 *this_00;
  uint uVar9;
  Orientation orientation;
  ulong i;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_100;
  QRect local_e8;
  uchar shown;
  QArrayDataPointer<char16_t> local_c8;
  QToolBarAreaLayoutLine local_a8;
  int cnt;
  int pos;
  int lines;
  QArrayDataPointer<QToolBar_*> local_68;
  QToolBarAreaLayoutItem local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (_toolBars->d).d;
  local_68.ptr = (_toolBars->d).ptr;
  local_68.size = (_toolBars->d).size;
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lines = -0x55555556;
  QDataStream::operator>>(stream,&lines);
  iVar7 = 0;
  do {
    if (lines <= iVar7) {
      bVar2 = stream[0x13] == (QDataStream)0x0;
LAB_00470e1f:
      QArrayDataPointer<QToolBar_*>::~QArrayDataPointer(&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return bVar2;
    }
    pos = -0x55555556;
    QDataStream::operator>>(stream,&pos);
    if (3 < (uint)pos) {
      bVar2 = false;
      goto LAB_00470e1f;
    }
    cnt = -0x55555556;
    QDataStream::operator>>(stream,&cnt);
    lVar8 = (long)pos;
    local_a8.rect.x1.m_i = 0;
    local_a8.rect.y1.m_i = 0;
    local_a8.rect.x2.m_i = -1;
    local_a8.rect.y2.m_i = -1;
    local_a8._20_4_ = 0xaaaaaaaa;
    local_a8.o = this->docks[lVar8].o;
    local_a8.toolBarItems.d.d = (Data *)0x0;
    local_a8.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
    local_a8.toolBarItems.d.size = 0;
    for (iVar6 = 0; iVar6 < cnt; iVar6 = iVar6 + 1) {
      local_50.widgetItem = (QLayoutItem *)0x0;
      local_50.pos = 0;
      local_50.size = -1;
      local_50.preferredSize = -1;
      local_50.gap = false;
      local_50._21_3_ = 0xaaaaaa;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (char16_t *)0x0;
      local_c8.size = 0;
      ::operator>>(stream,(QString *)&local_c8);
      shown = 0xaa;
      QDataStream::operator>>(stream,&shown);
      iVar3 = getInt(stream);
      local_50.pos = iVar3;
      iVar3 = getInt(stream);
      local_50.size = iVar3;
      local_e8.x1.m_i = 0;
      local_e8.y1.m_i = 0;
      local_e8.x2.m_i = -1;
      local_e8.y2.m_i = -1;
      uVar4 = getInt(stream);
      if (tmarker == 0xfc) {
        uVar5 = getInt(stream);
        if ((uVar4 & 1) == 0) {
          local_e8.x1.m_i = 0;
          local_e8.y1.m_i = 0;
          local_e8.x2.m_i = -1;
          local_e8.y2.m_i = -1;
        }
        else {
          uVar9 = uVar4 >> 1 & 0xffff;
          local_e8.x2.m_i = ((uVar4 >> 0x11) - 0x8000) + uVar9;
          local_e8.y1.m_i = (uVar5 & 0xffff) - 0x7fff;
          local_e8.x1.m_i = uVar9 - 0x7fff;
          local_e8.y2.m_i = (uVar5 >> 0x10) + (uVar5 & 0xffff) + -0x8000;
        }
      }
      else {
        uVar4 = 0;
      }
      uVar1 = 0;
      do {
        i = uVar1;
        if ((ulong)local_68.size <= i) goto LAB_00470dce;
        QObject::objectName();
        bVar2 = ::comparesEqual((QString *)&local_100,(QString *)&local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
        uVar1 = i + 1;
      } while (!bVar2);
      widget = &QList<QToolBar_*>::takeAt((QList<QToolBar_*> *)&local_68,i)->super_QWidget;
      if (widget != (QWidget *)0x0 && !testing) {
        *(undefined8 *)(*(long *)&widget->field_0x8 + 0xb0) = 0;
        this_00 = (QWidgetItemV2 *)operator_new(0x58);
        QWidgetItemV2::QWidgetItemV2(this_00,widget);
        if ((uVar4 & 1) == 0) {
          orientation = this->docks[lVar8].o;
        }
        else {
          orientation = Vertical - ((shown & 2) == 0);
        }
        local_50.widgetItem = (QLayoutItem *)this_00;
        QToolBar::setOrientation((QToolBar *)widget,orientation);
        (**(code **)(*(long *)widget + 0x68))(widget,shown & 1);
        QToolBarPrivate::setWindowState
                  (*(QToolBarPrivate **)&widget->field_0x8,(bool)((byte)uVar4 & 1),false,&local_e8);
        local_50.preferredSize = local_50.size;
        QList<QToolBarAreaLayoutItem>::emplaceBack<QToolBarAreaLayoutItem_const&>
                  (&local_a8.toolBarItems,&local_50);
      }
LAB_00470dce:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    }
    if (!testing) {
      QList<QToolBarAreaLayoutLine>::emplaceBack<QToolBarAreaLayoutLine_const&>
                (&this->docks[lVar8].lines,&local_a8);
    }
    QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_a8.toolBarItems.d);
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool QToolBarAreaLayout::restoreState(QDataStream &stream, const QList<QToolBar*> &_toolBars, uchar tmarker, bool testing)
{
    QList<QToolBar*> toolBars = _toolBars;
    int lines;
    stream >> lines;

    for (int j = 0; j < lines; ++j) {
        int pos;
        stream >> pos;
        if (pos < 0 || pos >= QInternal::DockCount)
            return false;
        int cnt;
        stream >> cnt;

        QToolBarAreaLayoutInfo &dock = docks[pos];
        const bool applyingLayout = !testing;
        QToolBarAreaLayoutLine line(dock.o);

        for (int k = 0; k < cnt; ++k) {
            QToolBarAreaLayoutItem item;

            QString objectName;
            stream >> objectName;
            uchar shown;
            stream >> shown;
            item.pos = getInt(stream);
            item.size = getInt(stream);

            /*
               4.3.0 added floating toolbars, but failed to add the ability to restore them.
               We need to store there geometry (four ints). We cannot change the format in a
               patch release (4.3.1) by adding ToolBarStateMarkerEx2 to signal extra data. So
               for now we'll pack it in the two legacy ints we no longer used in Qt4.3.0.
               In 4.4, we should add ToolBarStateMarkerEx2 and fix this properly.
            */

            QRect rect;
            bool floating = false;
            uint geom0, geom1;
            geom0 = getInt(stream);
            if (tmarker == ToolBarStateMarkerEx) {
                geom1 = getInt(stream);
                rect = unpackRect(geom0, geom1, &floating);
            }

            QToolBar *toolBar = nullptr;
            for (int x = 0; x < toolBars.size(); ++x) {
                if (toolBars.at(x)->objectName() == objectName) {
                    toolBar = toolBars.takeAt(x);
                    break;
                }
            }
            if (toolBar == nullptr) {
                continue;
            }

            if (applyingLayout) {
                // Clear the previous widgetItem for the toolBar, so that it's
                // assigned correctly in QWidgetItemV2 constructor.
                auto *toolBarPrivate = QWidgetPrivate::get(toolBar);
                toolBarPrivate->widgetItem = nullptr;
                item.widgetItem = new QWidgetItemV2(toolBar);
                toolBar->setOrientation(floating ? ((shown & 2) ? Qt::Vertical : Qt::Horizontal) : dock.o);
                toolBar->setVisible(shown & 1);
                toolBar->d_func()->setWindowState(floating, false, rect);

                item.preferredSize = item.size;
                line.toolBarItems.append(item);
            }
        }

        if (applyingLayout) {
            dock.lines.append(line);
        }
    }


    return stream.status() == QDataStream::Ok;
}